

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void setCursorImage(_GLFWwindow *window,_GLFWcursorWayland *cursorWayland)

{
  uint uVar1;
  wl_cursor *pwVar2;
  wl_cursor_image *pwVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wl_pointer *pwVar6;
  wl_surface *pwVar7;
  PFN_wl_proxy_marshal_flags p_Var8;
  uint32_t uVar9;
  uint32_t uVar10;
  wl_cursor *pwVar11;
  uint32_t uVar12;
  uint uVar13;
  wl_buffer *local_70;
  itimerspec timer;
  
  pwVar7 = _glfw.wl.cursorSurface;
  timer.it_value.tv_sec = 0;
  timer.it_value.tv_nsec = 0;
  timer.it_interval.tv_sec = 0;
  timer.it_interval.tv_nsec = 0;
  pwVar11 = cursorWayland->cursor;
  if (pwVar11 == (wl_cursor *)0x0) {
    local_70 = cursorWayland->buffer;
    uVar10 = cursorWayland->xhot;
    uVar12 = cursorWayland->yhot;
    uVar13 = 1;
  }
  else {
    uVar13 = 1;
    if (1 < (window->wl).bufferScale) {
      pwVar2 = cursorWayland->cursorHiDPI;
      if (pwVar2 != (wl_cursor *)0x0) {
        pwVar11 = pwVar2;
      }
      uVar13 = (pwVar2 != (wl_cursor *)0x0) + 1;
    }
    pwVar3 = pwVar11->images[cursorWayland->currentImage];
    local_70 = (*_glfw.wl.cursor.image_get_buffer)(pwVar3);
    if (local_70 == (wl_buffer *)0x0) {
      return;
    }
    timer.it_value.tv_sec = (ulong)pwVar3->delay / 1000;
    timer.it_value.tv_nsec = (__syscall_slong_t)((pwVar3->delay % 1000) * 1000000);
    timerfd_settime(_glfw.wl.cursorTimerfd,0,(itimerspec *)&timer,(itimerspec *)0x0);
    uVar4 = pwVar3->height;
    uVar9 = pwVar3->hotspot_x;
    uVar5 = pwVar3->hotspot_y;
    uVar10 = pwVar3->hotspot_x;
    uVar12 = pwVar3->hotspot_y;
    cursorWayland->width = pwVar3->width;
    cursorWayland->height = uVar4;
    cursorWayland->xhot = uVar9;
    cursorWayland->yhot = uVar5;
  }
  p_Var8 = _glfw.wl.client.proxy_marshal_flags;
  uVar4 = _glfw.wl.pointerEnterSerial;
  pwVar6 = _glfw.wl.pointer;
  uVar9 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.pointer);
  (*p_Var8)((wl_proxy *)pwVar6,0,(wl_interface *)0x0,uVar9,0,(ulong)uVar4,pwVar7,
            (ulong)(uint)((int)uVar10 / (int)uVar13),
            (long)(int)uVar12 / (long)(int)uVar13 & 0xffffffff);
  p_Var8 = _glfw.wl.client.proxy_marshal_flags;
  uVar10 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)pwVar7);
  (*p_Var8)((wl_proxy *)pwVar7,8,(wl_interface *)0x0,uVar10,0,(ulong)uVar13);
  p_Var8 = _glfw.wl.client.proxy_marshal_flags;
  uVar10 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)pwVar7);
  (*p_Var8)((wl_proxy *)pwVar7,1,(wl_interface *)0x0,uVar10,0,local_70,0,0);
  p_Var8 = _glfw.wl.client.proxy_marshal_flags;
  uVar13 = cursorWayland->width;
  uVar1 = cursorWayland->height;
  uVar10 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)pwVar7);
  (*p_Var8)((wl_proxy *)pwVar7,2,(wl_interface *)0x0,uVar10,0,0,0,(ulong)uVar13,(ulong)uVar1);
  p_Var8 = _glfw.wl.client.proxy_marshal_flags;
  uVar10 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)pwVar7);
  (*p_Var8)((wl_proxy *)pwVar7,6,(wl_interface *)0x0,uVar10,0);
  return;
}

Assistant:

static void setCursorImage(_GLFWwindow* window,
                           _GLFWcursorWayland* cursorWayland)
{
    struct itimerspec timer = {0};
    struct wl_cursor* wlCursor = cursorWayland->cursor;
    struct wl_cursor_image* image;
    struct wl_buffer* buffer;
    struct wl_surface* surface = _glfw.wl.cursorSurface;
    int scale = 1;

    if (!wlCursor)
        buffer = cursorWayland->buffer;
    else
    {
        if (window->wl.bufferScale > 1 && cursorWayland->cursorHiDPI)
        {
            wlCursor = cursorWayland->cursorHiDPI;
            scale = 2;
        }

        image = wlCursor->images[cursorWayland->currentImage];
        buffer = wl_cursor_image_get_buffer(image);
        if (!buffer)
            return;

        timer.it_value.tv_sec = image->delay / 1000;
        timer.it_value.tv_nsec = (image->delay % 1000) * 1000000;
        timerfd_settime(_glfw.wl.cursorTimerfd, 0, &timer, NULL);

        cursorWayland->width = image->width;
        cursorWayland->height = image->height;
        cursorWayland->xhot = image->hotspot_x;
        cursorWayland->yhot = image->hotspot_y;
    }

    wl_pointer_set_cursor(_glfw.wl.pointer, _glfw.wl.pointerEnterSerial,
                          surface,
                          cursorWayland->xhot / scale,
                          cursorWayland->yhot / scale);
    wl_surface_set_buffer_scale(surface, scale);
    wl_surface_attach(surface, buffer, 0, 0);
    wl_surface_damage(surface, 0, 0,
                      cursorWayland->width, cursorWayland->height);
    wl_surface_commit(surface);
}